

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 ImGui::GetNavInputAmount2d
                 (ImGuiNavDirSourceFlags dir_sources,ImGuiInputReadMode mode,float slow_factor,
                 float fast_factor)

{
  bool bVar1;
  uint in_EDI;
  float in_XMM0_Da;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float in_XMM1_Da;
  ImVec2 delta;
  float in_stack_ffffffffffffffbc;
  float in_stack_ffffffffffffffc0;
  ImVec2 local_30;
  ImVec2 local_28;
  ImVec2 local_20;
  float local_18;
  float local_14;
  uint local_c;
  ImVec2 local_8;
  
  local_18 = in_XMM1_Da;
  local_14 = in_XMM0_Da;
  local_c = in_EDI;
  ImVec2::ImVec2(&local_8,0.0,0.0);
  if ((local_c & 1) != 0) {
    fVar2 = GetNavInputAmount((ImGuiNavInput)in_stack_ffffffffffffffc0,
                              (ImGuiInputReadMode)in_stack_ffffffffffffffbc);
    fVar3 = GetNavInputAmount((ImGuiNavInput)in_stack_ffffffffffffffc0,
                              (ImGuiInputReadMode)in_stack_ffffffffffffffbc);
    fVar4 = GetNavInputAmount((ImGuiNavInput)in_stack_ffffffffffffffc0,
                              (ImGuiInputReadMode)in_stack_ffffffffffffffbc);
    fVar5 = GetNavInputAmount((ImGuiNavInput)in_stack_ffffffffffffffc0,
                              (ImGuiInputReadMode)in_stack_ffffffffffffffbc);
    ImVec2::ImVec2(&local_20,fVar2 - fVar3,fVar4 - fVar5);
    ::operator+=(&local_8,&local_20);
  }
  if ((local_c & 2) != 0) {
    fVar2 = GetNavInputAmount((ImGuiNavInput)in_stack_ffffffffffffffc0,
                              (ImGuiInputReadMode)in_stack_ffffffffffffffbc);
    in_stack_ffffffffffffffc0 =
         GetNavInputAmount((ImGuiNavInput)in_stack_ffffffffffffffc0,
                           (ImGuiInputReadMode)in_stack_ffffffffffffffbc);
    in_stack_ffffffffffffffc0 = fVar2 - in_stack_ffffffffffffffc0;
    in_stack_ffffffffffffffbc =
         GetNavInputAmount((ImGuiNavInput)in_stack_ffffffffffffffc0,
                           (ImGuiInputReadMode)in_stack_ffffffffffffffbc);
    fVar2 = GetNavInputAmount((ImGuiNavInput)in_stack_ffffffffffffffc0,
                              (ImGuiInputReadMode)in_stack_ffffffffffffffbc);
    ImVec2::ImVec2(&local_28,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc - fVar2);
    ::operator+=(&local_8,&local_28);
  }
  if ((local_c & 4) != 0) {
    fVar2 = GetNavInputAmount((ImGuiNavInput)in_stack_ffffffffffffffc0,
                              (ImGuiInputReadMode)in_stack_ffffffffffffffbc);
    fVar3 = GetNavInputAmount((ImGuiNavInput)in_stack_ffffffffffffffc0,
                              (ImGuiInputReadMode)in_stack_ffffffffffffffbc);
    fVar4 = GetNavInputAmount((ImGuiNavInput)in_stack_ffffffffffffffc0,
                              (ImGuiInputReadMode)in_stack_ffffffffffffffbc);
    fVar5 = GetNavInputAmount((ImGuiNavInput)in_stack_ffffffffffffffc0,
                              (ImGuiInputReadMode)in_stack_ffffffffffffffbc);
    ImVec2::ImVec2(&local_30,fVar2 - fVar3,fVar4 - fVar5);
    ::operator+=(&local_8,&local_30);
  }
  if (((local_14 != 0.0) || (NAN(local_14))) && (bVar1 = IsNavInputDown(0xe), bVar1)) {
    operator*=(&local_8,local_14);
  }
  if (((local_18 != 0.0) || (NAN(local_18))) && (bVar1 = IsNavInputDown(0xf), bVar1)) {
    operator*=(&local_8,local_18);
  }
  return local_8;
}

Assistant:

ImVec2 ImGui::GetNavInputAmount2d(ImGuiNavDirSourceFlags dir_sources, ImGuiInputReadMode mode, float slow_factor, float fast_factor)
{
    ImVec2 delta(0.0f, 0.0f);
    if (dir_sources & ImGuiNavDirSourceFlags_Keyboard)
        delta += ImVec2(GetNavInputAmount(ImGuiNavInput_KeyRight_, mode)   - GetNavInputAmount(ImGuiNavInput_KeyLeft_,   mode), GetNavInputAmount(ImGuiNavInput_KeyDown_,   mode) - GetNavInputAmount(ImGuiNavInput_KeyUp_,   mode));
    if (dir_sources & ImGuiNavDirSourceFlags_PadDPad)
        delta += ImVec2(GetNavInputAmount(ImGuiNavInput_DpadRight, mode)   - GetNavInputAmount(ImGuiNavInput_DpadLeft,   mode), GetNavInputAmount(ImGuiNavInput_DpadDown,   mode) - GetNavInputAmount(ImGuiNavInput_DpadUp,   mode));
    if (dir_sources & ImGuiNavDirSourceFlags_PadLStick)
        delta += ImVec2(GetNavInputAmount(ImGuiNavInput_LStickRight, mode) - GetNavInputAmount(ImGuiNavInput_LStickLeft, mode), GetNavInputAmount(ImGuiNavInput_LStickDown, mode) - GetNavInputAmount(ImGuiNavInput_LStickUp, mode));
    if (slow_factor != 0.0f && IsNavInputDown(ImGuiNavInput_TweakSlow))
        delta *= slow_factor;
    if (fast_factor != 0.0f && IsNavInputDown(ImGuiNavInput_TweakFast))
        delta *= fast_factor;
    return delta;
}